

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNRand.cpp
# Opt level: O0

void __thiscall NaPNRandomGen::set_uniform_distrib(NaPNRandomGen *this,NaReal *fMin,NaReal *fMax)

{
  uint uVar1;
  undefined4 *puVar2;
  long in_RDX;
  long in_RSI;
  NaReal in_RDI;
  uint i;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar3;
  uint uVar4;
  
  NaPetriNode::check_tunable((NaPetriNode *)0x150192);
  if (((*(long *)((long)in_RDI + 0x110) != 0) && (in_RSI != 0)) && (in_RDX != 0)) {
    uVar3 = 0;
    while( true ) {
      uVar4 = uVar3;
      uVar1 = (**(code **)(**(long **)((long)in_RDI + 0x110) + 0x48))();
      if (uVar1 <= uVar3) break;
      NaRandomSequence::SetDistribution
                ((NaRandomSequence *)CONCAT44(uVar4,in_stack_ffffffffffffffe0),
                 (NaRandomDistribution)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0));
      NaRandomSequence::SetUniformParams
                ((NaRandomSequence *)CONCAT44(uVar4,in_stack_ffffffffffffffe0),in_RDI,
                 (NaReal)CONCAT44(uVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
      uVar3 = uVar4 + 1;
    }
    return;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0;
  __cxa_throw(puVar2,&NaException::typeinfo,0);
}

Assistant:

void
NaPNRandomGen::set_uniform_distrib (const NaReal* fMin, const NaReal* fMax)
{
  check_tunable();

  if(NULL == pUnit || NULL == fMin || NULL == fMax)
    throw(na_null_pointer);

  // Setup distribution parameters
  for(unsigned i = 0; i < pUnit->InputDim(); ++i)
    {
      pRandGen->SetDistribution(rdUniform, i);
      pRandGen->SetUniformParams(fMin[i], fMax[i], i);
    }
}